

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListView::mouseMoveEvent(QListView *this,QMouseEvent *e)

{
  long lVar1;
  bool bVar2;
  State SVar3;
  undefined4 uVar4;
  int iVar5;
  QListViewPrivate *this_00;
  QStyle *pQVar6;
  undefined8 in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QRect QVar7;
  int margin;
  QListViewPrivate *d;
  QRect viewPortRect;
  QRect rect;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  QWidget *this_01;
  QPointF *in_stack_ffffffffffffff50;
  undefined1 extend;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  QRect *this_02;
  QMouseEvent *local_60;
  QAbstractItemView *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = in_RDI;
  bVar2 = QWidget::isVisible((QWidget *)0x8786b5);
  if (bVar2) {
    this_00 = d_func((QListView *)0x8786c8);
    QAbstractItemView::mouseMoveEvent(in_stack_ffffffffffffffb0,local_60);
    SVar3 = QAbstractItemView::state
                      ((QAbstractItemView *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    if ((((SVar3 == DragSelectingState) && ((this_00->showElasticBand & 1U) != 0)) &&
        ((this_00->super_QAbstractItemViewPrivate).selectionMode != SingleSelection)) &&
       ((this_00->super_QAbstractItemViewPrivate).selectionMode != NoSelection)) {
      this_01 = (QWidget *)&(this_00->super_QAbstractItemViewPrivate).pressedPosition;
      QSinglePointEvent::position((QSinglePointEvent *)0x87875d);
      QPointF::toPoint(in_stack_ffffffffffffff50);
      uVar4 = (**(code **)((long)*(QPoint *)in_RDI + 0x2b0))();
      (**(code **)((long)*(QPoint *)in_RDI + 0x2b8))();
      QPoint::QPoint((QPoint *)CONCAT44(uVar4,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c,
                     in_stack_ffffffffffffff38);
      ::operator+((QPoint *)in_stack_ffffffffffffff50,(QPoint *)this_01);
      QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (QPoint *)in_RDI,(QPoint *)in_stack_ffffffffffffff50);
      extend = (undefined1)((ulong)in_RDI >> 0x38);
      QVar7 = (QRect)QRect::normalized();
      pQVar6 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      iVar5 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,5,0);
      iVar5 = iVar5 << 1;
      QRect::united((QRect *)CONCAT44(uVar4,in_stack_ffffffffffffff40),
                    (QRect *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      QRect::adjusted(this_02,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,(int)((ulong)this_00 >> 0x20)
                      ,(int)this_00);
      QListViewPrivate::mapToViewport
                (this_00,(QRect *)CONCAT44(iVar5,in_stack_ffffffffffffff60),(bool)extend);
      QWidget::update(this_01,(QRect *)CONCAT44(uVar4,in_stack_ffffffffffffff40));
      this_00->elasticBand = QVar7;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListView::mouseMoveEvent(QMouseEvent *e)
{
    if (!isVisible())
        return;
    Q_D(QListView);
    QAbstractItemView::mouseMoveEvent(e);
    if (state() == DragSelectingState
        && d->showElasticBand
        && d->selectionMode != SingleSelection
        && d->selectionMode != NoSelection) {
        QRect rect(d->pressedPosition, e->position().toPoint() + QPoint(horizontalOffset(), verticalOffset()));
        rect = rect.normalized();
        const int margin = 2 * style()->pixelMetric(QStyle::PM_DefaultFrameWidth);
        const QRect viewPortRect = rect.united(d->elasticBand)
                                       .adjusted(-margin, -margin, margin, margin);
        d->viewport->update(d->mapToViewport(viewPortRect));
        d->elasticBand = rect;
    }
}